

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::Function::RegisterSelectionMerge(Function *this,uint32_t merge_id)

{
  mapped_type pBVar1;
  BasicBlock *exit;
  mapped_type *ppBVar2;
  BasicBlock *entry;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> local_70;
  Construct local_58;
  BasicBlock *local_28;
  BasicBlock *local_20;
  BasicBlock *merge_block;
  Function *pFStack_10;
  uint32_t merge_id_local;
  Function *this_local;
  
  merge_block._4_4_ = merge_id;
  pFStack_10 = this;
  RegisterBlock(this,merge_id,false);
  local_20 = std::
             unordered_map<unsigned_int,_spvtools::val::BasicBlock,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>_>
             ::at(&this->blocks_,(key_type *)((long)&merge_block + 4));
  BasicBlock::set_type(this->current_block_,kBlockTypeSelection);
  BasicBlock::set_type(local_20,kBlockTypeMerge);
  pBVar1 = this->current_block_;
  local_28 = local_20;
  ppBVar2 = std::
            unordered_map<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>_>_>
            ::operator[](&this->merge_block_header_,&local_28);
  *ppBVar2 = pBVar1;
  BasicBlock::RegisterStructuralSuccessor(this->current_block_,local_20);
  entry = current_block(this);
  exit = local_20;
  memset(&local_70,0,0x18);
  std::vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::vector
            (&local_70);
  Construct::Construct(&local_58,kSelection,entry,exit,&local_70);
  AddConstruct(this,&local_58);
  Construct::~Construct(&local_58);
  std::vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::~vector
            (&local_70);
  return SPV_SUCCESS;
}

Assistant:

spv_result_t Function::RegisterSelectionMerge(uint32_t merge_id) {
  RegisterBlock(merge_id, false);
  BasicBlock& merge_block = blocks_.at(merge_id);
  current_block_->set_type(kBlockTypeSelection);
  merge_block.set_type(kBlockTypeMerge);
  merge_block_header_[&merge_block] = current_block_;
  current_block_->RegisterStructuralSuccessor(&merge_block);

  AddConstruct({ConstructType::kSelection, current_block(), &merge_block});

  return SPV_SUCCESS;
}